

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::LogText(char *fmt,...)

{
  ImGuiTextBuffer *this;
  int *piVar1;
  char *pcVar2;
  ImGuiContext *pIVar3;
  char in_AL;
  int iVar4;
  char *pcVar5;
  int iVar6;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  __va_list_tag local_108;
  undefined1 local_e8 [8];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  pIVar3 = GImGui;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  if (GImGui->LogEnabled == true) {
    local_108.reg_save_area = local_e8;
    local_108.overflow_arg_area = &args[0].overflow_arg_area;
    local_108.gp_offset = 8;
    local_108.fp_offset = 0x30;
    this = &GImGui->LogBuffer;
    local_e0 = in_RSI;
    local_d8 = in_RDX;
    local_d0 = in_RCX;
    local_c8 = in_R8;
    local_c0 = in_R9;
    if (GImGui->LogFile == (ImFileHandle)0x0) {
      ImGuiTextBuffer::appendfv(this,fmt,&local_108);
    }
    else {
      iVar6 = (GImGui->LogBuffer).Buf.Capacity;
      if (iVar6 < 0) {
        iVar6 = iVar6 / 2 + iVar6;
        iVar4 = 0;
        if (0 < iVar6) {
          iVar4 = iVar6;
        }
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        pcVar5 = (char *)(*GImAllocatorAllocFunc)((size_t)iVar4,GImAllocatorUserData);
        pcVar2 = (pIVar3->LogBuffer).Buf.Data;
        if (pcVar2 != (char *)0x0) {
          memcpy(pcVar5,pcVar2,(long)(pIVar3->LogBuffer).Buf.Size);
          pcVar2 = (pIVar3->LogBuffer).Buf.Data;
          if ((pcVar2 != (char *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(pcVar2,GImAllocatorUserData);
        }
        (pIVar3->LogBuffer).Buf.Data = pcVar5;
        (pIVar3->LogBuffer).Buf.Capacity = iVar4;
      }
      (pIVar3->LogBuffer).Buf.Size = 0;
      ImGuiTextBuffer::appendfv(this,fmt,&local_108);
      pcVar2 = (pIVar3->LogBuffer).Buf.Data;
      pcVar5 = ImGuiTextBuffer::EmptyString;
      if (pcVar2 != (char *)0x0) {
        pcVar5 = pcVar2;
      }
      iVar6 = (pIVar3->LogBuffer).Buf.Size;
      iVar4 = iVar6 + -1;
      if (iVar6 == 0) {
        iVar4 = 0;
      }
      fwrite(pcVar5,1,(long)iVar4,(FILE *)pIVar3->LogFile);
    }
  }
  return;
}

Assistant:

void ImGui::LogText(const char* fmt, ...)
{
    ImGuiContext& g = *GImGui;
    if (!g.LogEnabled)
        return;

    va_list args;
    va_start(args, fmt);
    if (g.LogFile)
    {
        g.LogBuffer.Buf.resize(0);
        g.LogBuffer.appendfv(fmt, args);
        ImFileWrite(g.LogBuffer.c_str(), sizeof(char), (ImU64)g.LogBuffer.size(), g.LogFile);
    }
    else
    {
        g.LogBuffer.appendfv(fmt, args);
    }
    va_end(args);
}